

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O2

void __thiscall
MinVR::VRFakeTrackerDevice::onVREvent(VRFakeTrackerDevice *this,VRDataIndex *eventData)

{
  string *psVar1;
  VRVector3 *this_00;
  float fVar2;
  float fVar3;
  __type _Var4;
  bool bVar5;
  VRAnyCoreType VVar6;
  float *pfVar7;
  VRMatrix4 *this_01;
  float xx;
  float fVar8;
  float fVar9;
  VRMatrix4 local_310;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  VRDataIndex di;
  VRMatrix4 local_218;
  VRPoint3 here;
  VRVector3 up;
  VRFloatArray screenPos;
  _Vector_base<float,_std::allocator<float>_> local_178;
  VRVector3 over;
  string local_128;
  VRMatrix4 local_108;
  VRDataIndex local_c0;
  
  psVar1 = &eventData->_indexName;
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_toggleEvent);
  std::__cxx11::string::~string((string *)&di);
  if (_Var4) {
    bVar5 = this->_tracking;
    this->_tracking = (bool)(bVar5 ^ 1);
    if (bVar5 != false) {
      return;
    }
    if (this->_sticky == true) {
LAB_0013b582:
      this->_state = XYTranslating;
      return;
    }
LAB_0013b72d:
    this->_state = None;
    return;
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_translateZOnEvent);
  std::__cxx11::string::~string((string *)&di);
  if (_Var4) {
    if (this->_state != ZTranslating) {
      this->_state = ZTranslating;
      return;
    }
    goto LAB_0013b72d;
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_translateOnEvent);
  std::__cxx11::string::~string((string *)&di);
  if (_Var4) {
    if (this->_state != XYTranslating) goto LAB_0013b582;
    goto LAB_0013b72d;
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_rotateOnEvent);
  std::__cxx11::string::~string((string *)&di);
  if (_Var4) {
    if (this->_state != Rotating) {
      this->_state = Rotating;
      return;
    }
    goto LAB_0013b72d;
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_rollOnEvent);
  std::__cxx11::string::~string((string *)&di);
  if (_Var4) {
    if (this->_state != Rolling) {
      this->_state = Rolling;
      return;
    }
    goto LAB_0013b72d;
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_translateZOffEvent);
  if (_Var4) {
    bVar5 = this->_sticky;
    std::__cxx11::string::~string((string *)&di);
    if (bVar5 == false) goto LAB_0013b72d;
  }
  else {
    std::__cxx11::string::~string((string *)&di);
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_translateOffEvent);
  if (_Var4) {
    bVar5 = this->_sticky;
    std::__cxx11::string::~string((string *)&di);
    if (bVar5 == false) goto LAB_0013b72d;
  }
  else {
    std::__cxx11::string::~string((string *)&di);
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_rotateOffEvent);
  if (_Var4) {
    bVar5 = this->_sticky;
    std::__cxx11::string::~string((string *)&di);
    if (bVar5 == false) goto LAB_0013b72d;
  }
  else {
    std::__cxx11::string::~string((string *)&di);
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_rollOffEvent);
  if (_Var4) {
    bVar5 = this->_sticky;
    std::__cxx11::string::~string((string *)&di);
    if (bVar5 == false) goto LAB_0013b72d;
  }
  else {
    std::__cxx11::string::~string((string *)&di);
  }
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          "Mouse_Move");
  std::__cxx11::string::~string((string *)&di);
  if (!bVar5) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&di,"NormalizedPosition",(allocator<char> *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"",(allocator<char> *)&local_218);
  VVar6 = VRDataIndex::getValue(eventData,(string *)&di,&local_128,true);
  (*(VVar6.datum)->_vptr_VRDatum[0xd])(&screenPos,VVar6.datum);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&di);
  if (screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_0013bda9;
  fVar9 = (1.0 - screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[1]) + -0.5;
  fVar8 = *screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + -0.5 +
          *screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + -0.5;
  fVar9 = fVar9 + fVar9;
  if (this->_tracking != true) goto LAB_0013bd9a;
  if (Rolling < this->_state) goto LAB_0013bcdb;
  local_2c8 = fVar9 - this->_lastMouseY;
  xx = fVar8 - this->_lastMouseX;
  fStack_2c4 = fVar9;
  fStack_2c0 = fVar9;
  fStack_2bc = fVar9;
  switch(this->_state) {
  case XYTranslating:
    if (this->_seeker == true) {
      fVar2 = this->_xyScale;
      VRVector3::VRVector3((VRVector3 *)&local_218,xx,0.0,local_2c8);
      operator*((VRVector3 *)&local_310,fVar2,(VRVector3 *)&local_218);
      operator+((VRVector3 *)&di,(VRVector3 *)&local_310,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)&di);
    }
    else {
      fVar2 = this->_xyScale;
      VRVector3::VRVector3((VRVector3 *)&local_218,xx,local_2c8,0.0);
      operator*((VRVector3 *)&local_310,fVar2,(VRVector3 *)&local_218);
      operator+((VRVector3 *)&di,(VRVector3 *)&local_310,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)&di);
    }
    VRVector3::~VRVector3((VRVector3 *)&di);
    VRVector3::~VRVector3((VRVector3 *)&local_310);
    this_01 = &local_218;
    break;
  case ZTranslating:
    if (this->_seeker == true) {
      VRVector3::VRVector3((VRVector3 *)&local_310,0.0,local_2c8 * this->_zScale,0.0);
      operator+((VRVector3 *)&di,(VRVector3 *)&local_310,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)&di);
    }
    else {
      VRVector3::VRVector3((VRVector3 *)&local_310,0.0,0.0,local_2c8 * this->_zScale);
      operator+((VRVector3 *)&di,(VRVector3 *)&local_310,&this->_statePos);
      VRVector3::operator=(&this->_statePos,(VRVector3 *)&di);
    }
    VRVector3::~VRVector3((VRVector3 *)&di);
    this_01 = &local_310;
    break;
  case Rotating:
    VRMatrix4::VRMatrix4((VRMatrix4 *)&di);
    if (this->_seeker == true) {
      VRVector3::VRVector3((VRVector3 *)&local_310,0.0,1.0,0.0);
      operator*(&up,&this->_stateRot,(VRVector3 *)&local_310);
      VRVector3::~VRVector3((VRVector3 *)&local_310);
      this_00 = &this->_statePos;
      pfVar7 = VRVector3::operator[](this_00,0);
      fVar2 = *pfVar7;
      pfVar7 = VRVector3::operator[](this_00,1);
      fVar3 = *pfVar7;
      pfVar7 = VRVector3::operator[](this_00,2);
      VRPoint3::VRPoint3(&here,-fVar2,-fVar3,-*pfVar7);
      VRVector3::cross(&over,&up,this_00);
      VRMatrix4::rotation(&local_218,&here,&up,xx * this->_rScale);
      VRMatrix4::rotation(&local_108,&here,&over,local_2c8 * this->_rScale);
      operator*(&local_310,&local_218,&local_108);
      VRMatrix4::operator=((VRMatrix4 *)&di,&local_310);
      VRMatrix4::~VRMatrix4(&local_310);
      VRMatrix4::~VRMatrix4(&local_108);
      VRMatrix4::~VRMatrix4(&local_218);
      VRVector3::~VRVector3(&over);
      VRPoint3::~VRPoint3(&here);
      VRVector3::~VRVector3(&up);
    }
    else {
      VRMatrix4::rotationY(&local_218,xx * this->_rScale);
      VRMatrix4::rotationX(&local_108,local_2c8 * -this->_rScale);
      operator*(&local_310,&local_218,&local_108);
      VRMatrix4::operator=((VRMatrix4 *)&di,&local_310);
      VRMatrix4::~VRMatrix4(&local_310);
      VRMatrix4::~VRMatrix4(&local_108);
      VRMatrix4::~VRMatrix4(&local_218);
    }
    operator*(&local_310,(VRMatrix4 *)&di,&this->_stateRot);
    VRMatrix4::operator=(&this->_stateRot,&local_310);
    goto LAB_0013bcc7;
  case Rolling:
    VRMatrix4::rotationZ((VRMatrix4 *)&di,xx * this->_rScale);
    operator*(&local_310,(VRMatrix4 *)&di,&this->_stateRot);
    VRMatrix4::operator=(&this->_stateRot,&local_310);
LAB_0013bcc7:
    VRMatrix4::~VRMatrix4(&local_310);
    VRMatrix4::~VRMatrix4((VRMatrix4 *)&di);
    goto LAB_0013bcdb;
  }
  VRVector3::~VRVector3((VRVector3 *)this_01);
LAB_0013bcdb:
  VRMatrix4::translation(&local_310,&this->_statePos);
  operator*((VRMatrix4 *)&di,&local_310,&this->_stateRot);
  VRMatrix4::operator=(&this->_transform,(VRMatrix4 *)&di);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)&di);
  VRMatrix4::~VRMatrix4(&local_310);
  VRMatrix4::toVRFloatArray((VRFloatArray *)&local_178,&this->_transform);
  VRTrackerEvent::createValidDataIndex
            (&di,&this->_eventName,(vector<float,_std::allocator<float>_> *)&local_178);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_178);
  VRDataIndex::VRDataIndex(&local_c0,&di);
  VRDataQueue::push(&this->_pendingEvents,&local_c0);
  VRDataIndex::~VRDataIndex(&local_c0);
  VRDataIndex::~VRDataIndex(&di);
LAB_0013bd9a:
  this->_lastMouseX = fVar8;
  this->_lastMouseY = fVar9;
LAB_0013bda9:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&screenPos.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void VRFakeTrackerDevice::onVREvent(const VRDataIndex &eventData)
{
  if (eventData.getName() == _toggleEvent) {
    _tracking = !_tracking;
    if (_tracking) {
      if (_sticky) {
        _state = VRFakeTrackerDevice::XYTranslating;
      } else {
        _state = VRFakeTrackerDevice::None;
      }
    }
  }
  else if (eventData.getName() == _translateZOnEvent) {
    if (_state !=  VRFakeTrackerDevice::ZTranslating) {
      _state = VRFakeTrackerDevice::ZTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateOnEvent) {
    if (_state != VRFakeTrackerDevice::XYTranslating) {
      _state = VRFakeTrackerDevice::XYTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rotateOnEvent) {
    if (_state != VRFakeTrackerDevice::Rotating) {
      _state = VRFakeTrackerDevice::Rotating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rollOnEvent) {
    if (_state != VRFakeTrackerDevice::Rolling) {
      _state = VRFakeTrackerDevice::Rolling;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateZOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _translateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rotateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rollOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == "Mouse_Move") {
    const VRFloatArray screenPos = eventData.getValue("NormalizedPosition");
    if (!screenPos.empty()) {

      // Transform range from [0,1] to [-1,1].
      float mousex = 2.0f * (screenPos[0] - 0.5f);
      float mousey = 2.0f * ((1.0f - screenPos[1]) - 0.5f);

      // If we're not currently tracking, ignore the mouse.
      if (_tracking) {
        float deltaX = mousex - _lastMouseX;
        float deltaY = mousey - _lastMouseY;

        if (_state == VRFakeTrackerDevice::ZTranslating) {
          // If we're Z translating, that's up and down in the seeker mode, but
          // forward and backward in the looker mode.
          if (_seeker) {
            _statePos =  VRVector3(0, _zScale * deltaY, 0) + _statePos;
          } else {
            _statePos =  VRVector3(0, 0, _zScale * deltaY) + _statePos;
          }
        }
        else if (_state == VRFakeTrackerDevice::Rotating) {
          // The seeker mode turns the viewer around in place, while the looker
          // mode rotates the object in front of the viewer.  More or less.

          VRMatrix4 r;

          if (_seeker) {
            VRVector3 up = _stateRot * VRVector3(0.0f, 1.0f, 0.0f);
            // Not sure why these coordinates have to be negated.
            VRPoint3 here = VRPoint3(-_statePos[0], -_statePos[1], -_statePos[2]);
            VRVector3 over = up.cross(_statePos);

            r = VRMatrix4::rotation(here, up, _rScale * deltaX) *
              VRMatrix4::rotation(here, over, _rScale * deltaY);

          } else {
            r = VRMatrix4::rotationY(_rScale * deltaX) *
              VRMatrix4::rotationX(-_rScale * deltaY);
          }
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::Rolling) {
          VRMatrix4 r = VRMatrix4::rotationZ(_rScale * deltaX);
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::XYTranslating){
          // The seeker mode moves us in the horizontal plane, while the looker
          // mode moves us in a vertical plane.
          if (_seeker) {
            _statePos =  _xyScale * VRVector3(deltaX, 0, deltaY) + _statePos;
          } else {
            _statePos =  _xyScale * VRVector3(deltaX, deltaY, 0) + _statePos;
          }
        }

        _transform = VRMatrix4::translation(_statePos) * _stateRot;

        VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, _transform.toVRFloatArray());
        _pendingEvents.push(di);
      }

      _lastMouseX = mousex;
      _lastMouseY = mousey;
    }
  }
}